

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O1

void HFSubWorker::workerthreadController(zsock_t *pipe,void *args)

{
  zloop_t *loop;
  zsock_t *pull;
  zloop_t *local_38;
  zsock_t *local_30;
  
  zsock_signal(pipe,'\0');
  local_30 = zsock_new_checked(7,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
                               ,0x1a6);
  zsock_connect(local_30,*(char **)((long)args + 0xc0),0);
  local_38 = zloop_new();
  zloop_reader(local_38,local_30,pulltocallback,args);
  zloop_reader(local_38,pipe,HighFreqSub::pipeController,args);
  zloop_start(local_38);
  zsock_destroy_checked
            (&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
             ,0x1ac);
  zloop_destroy(&local_38);
  return;
}

Assistant:

void HFSubWorker::workerthreadController(zsock_t *pipe, void *args){
    zsock_signal(pipe, 0);
    HFSubWorker *self = (HFSubWorker*)args;
    zsock_t *pull = zsock_new(ZMQ_PULL);
    zsock_connect(pull, self->pullendpoint.c_str(), NULL);
    zloop_t *loop = zloop_new();
    zloop_reader(loop, pull, pulltocallback, self);
    zloop_reader(loop, pipe, pipeController, self);
    zloop_start(loop);
    zsock_destroy(&pull);
    zloop_destroy(&loop);
}